

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_destruct.cc
# Opt level: O0

void __thiscall re2c::Cases::~Cases(Cases *this)

{
  Case *pCVar1;
  State *pSVar2;
  Case *this_00;
  Cases *this_local;
  
  pCVar1 = this->cases;
  if (pCVar1 != (Case *)0x0) {
    pSVar2 = pCVar1[-1].to;
    this_00 = pCVar1 + (long)pSVar2;
    while (pCVar1 != this_00) {
      this_00 = this_00 + -1;
      Case::~Case(this_00);
    }
    operator_delete__(&pCVar1[-1].to,(long)pSVar2 * 0x20 + 8);
  }
  return;
}

Assistant:

Cases::~Cases ()
{
	delete [] cases;
}